

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brkeng.cpp
# Opt level: O3

int32_t __thiscall
icu_63::UnhandledEngine::findBreaks
          (UnhandledEngine *this,UText *text,int32_t param_2,int32_t endPos,UVector32 *param_4)

{
  UBool UVar1;
  UChar32 c;
  int64_t iVar2;
  
  while( true ) {
    c = utext_current32_63(text);
    iVar2 = utext_getNativeIndex_63(text);
    if (endPos <= (int)iVar2) {
      return 0;
    }
    UVar1 = UnicodeSet::contains(this->fHandled,c);
    if (UVar1 == '\0') break;
    utext_next32_63(text);
  }
  return 0;
}

Assistant:

int32_t
UnhandledEngine::findBreaks( UText *text,
                             int32_t /* startPos */,
                             int32_t endPos,
                             UVector32 &/*foundBreaks*/ ) const {
    UChar32 c = utext_current32(text); 
    while((int32_t)utext_getNativeIndex(text) < endPos && fHandled->contains(c)) {
        utext_next32(text);            // TODO:  recast loop to work with post-increment operations.
        c = utext_current32(text);
    }
    return 0;
}